

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

void __thiscall ot::commissioner::DtlsSession::Reset(DtlsSession *this)

{
  uchar *pw;
  uchar *puVar1;
  char *pcVar2;
  int aMbedtlsError;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar5;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  writer write;
  string local_b8;
  string local_98;
  writer local_78;
  size_t sStack_70;
  undefined1 local_68 [40];
  code *local_40;
  
  if (this->mState - kConnecting < 3) {
    mbedtls_ssl_session_reset(&this->mSsl);
    this->mIsClientIdSet = false;
    pw = (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    puVar1 = (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pw != puVar1) {
      aMbedtlsError = mbedtls_ssl_set_hs_ecjpake_password(&this->mSsl,pw,(long)puVar1 - (long)pw);
      if (aMbedtlsError != 0) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dtls","");
        local_68._0_4_ = string_type;
        pcVar3 = "reset EC-JPAKE password failed; {}";
        local_68._8_8_ = "reset EC-JPAKE password failed; {}";
        local_68._16_8_ = 0x22;
        local_68._24_8_ = 0x100000000;
        local_40 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_78.handler_ = (format_string_checker<char> *)local_68;
        local_68._32_8_ = (format_string_checker<char> *)local_68;
        do {
          if (pcVar3 == "") break;
          pcVar4 = pcVar3;
          if (*pcVar3 == '{') {
LAB_001beaa8:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&local_78,pcVar3,pcVar4);
            pcVar3 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar4,"",(format_string_checker<char> *)local_68);
            bVar5 = true;
          }
          else {
            pcVar4 = pcVar3 + 1;
            bVar5 = pcVar4 != "";
            if (bVar5) {
              if (*pcVar4 != '{') {
                pcVar2 = pcVar3 + 2;
                do {
                  pcVar4 = pcVar2;
                  bVar5 = pcVar4 != "";
                  if (pcVar4 == "") goto LAB_001beaa4;
                  pcVar2 = pcVar4 + 1;
                } while (*pcVar4 != '{');
              }
              bVar5 = true;
            }
LAB_001beaa4:
            if (bVar5) goto LAB_001beaa8;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&local_78,pcVar3,"");
            bVar5 = false;
          }
        } while (bVar5);
        ErrorFromMbedtlsError((Error *)local_68,aMbedtlsError);
        local_78.handler_ = (format_string_checker<char> *)local_68._8_8_;
        sStack_70 = local_68._16_8_;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x22;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_78;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_98,(v10 *)"reset EC-JPAKE password failed; {}",fmt,args);
        Log(kError,&local_b8,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((format_string_checker<char> *)local_68._8_8_ !=
            (format_string_checker<char> *)(local_68 + 0x18)) {
          operator_delete((void *)local_68._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
    }
    this->mState = kOpen;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dtls","");
    local_68._0_4_ = pointer_type;
    pcVar3 = "session(={}) is in invalid state";
    local_68._8_8_ = "session(={}) is in invalid state";
    local_68._16_8_ = 0x20;
    local_68._24_8_ = 0x100000000;
    local_40 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    local_78.handler_ = (format_string_checker<char> *)local_68;
    local_68._32_8_ = (format_string_checker<char> *)local_68;
    do {
      if (pcVar3 == "") break;
      pcVar4 = pcVar3;
      if (*pcVar3 == '{') {
LAB_001bec1f:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::
        writer::operator()((writer *)&local_78,pcVar3,pcVar4);
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                           (pcVar4,"",(format_string_checker<char> *)local_68);
        bVar5 = true;
      }
      else {
        pcVar4 = pcVar3 + 1;
        bVar5 = pcVar4 != "";
        if (bVar5) {
          if (*pcVar4 != '{') {
            pcVar2 = pcVar3 + 2;
            do {
              pcVar4 = pcVar2;
              bVar5 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_001bec1b;
              pcVar2 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar5 = true;
        }
LAB_001bec1b:
        if (bVar5) goto LAB_001bec1f;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::
        writer::operator()((writer *)&local_78,pcVar3,"");
        bVar5 = false;
      }
    } while (bVar5);
    fmt_00.size_ = 0xe;
    fmt_00.data_ = (char *)0x20;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_68;
    local_68._0_8_ = this;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_98,(v10 *)"session(={}) is in invalid state",fmt_00,args_00);
    Log(kWarn,&local_b8,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DtlsSession::Reset()
{
    if (mState != State::kConnecting && mState != State::kConnected && mState != State::kDisconnected)
    {
        LOG_WARN(LOG_REGION_DTLS, "session(={}) is in invalid state", static_cast<void *>(this));
        ExitNow();
    }

    mbedtls_ssl_session_reset(&mSsl);

    mIsClientIdSet = false;

    if (!mPSK.empty())
    {
        if (int fail = mbedtls_ssl_set_hs_ecjpake_password(&mSsl, mPSK.data(), mPSK.size()))
        {
            LOG_ERROR(LOG_REGION_DTLS, "reset EC-JPAKE password failed; {}", ErrorFromMbedtlsError(fail).GetMessage());
        }
    }

    mState = State::kOpen;

exit:
    return;
}